

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

_Bool aom_img_read(aom_image_t *img,FILE *file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *in_RSI;
  aom_image_t *in_RDI;
  int y;
  int h;
  int w;
  int stride;
  uchar *buf;
  int bytespp;
  int plane;
  int local_38;
  int local_30;
  uchar *local_28;
  int local_1c;
  
  iVar2 = 1;
  if ((in_RDI->fmt & 0x800) != AOM_IMG_FMT_NONE) {
    iVar2 = 2;
  }
  local_1c = 0;
  while( true ) {
    if (2 < local_1c) {
      return true;
    }
    local_28 = in_RDI->planes[local_1c];
    iVar1 = in_RDI->stride[local_1c];
    local_30 = aom_img_plane_width(in_RDI,local_1c);
    iVar3 = aom_img_plane_height(in_RDI,local_1c);
    if ((in_RDI->fmt == AOM_IMG_FMT_NV12) && (1 < local_1c)) break;
    if ((in_RDI->fmt == AOM_IMG_FMT_NV12) && (local_1c == 1)) {
      local_30 = local_30 << 1;
    }
    for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
      sVar4 = fread(local_28,(long)iVar2,(long)local_30,in_RSI);
      if (sVar4 != (long)local_30) {
        return false;
      }
      local_28 = local_28 + iVar1;
    }
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool aom_img_read(aom_image_t *img, FILE *file) {
  int plane;
  const int bytespp = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    int y;

    // Assuming that for nv12 we read all chroma data at once
    if (img->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (img->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;

    for (y = 0; y < h; ++y) {
      if (fread(buf, bytespp, w, file) != (size_t)w) return false;
      buf += stride;
    }
  }

  return true;
}